

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O0

void __thiscall
ObjTypeSpecFldInfoArray::EnsureArray
          (ObjTypeSpecFldInfoArray *this,Recycler *recycler,FunctionBody *functionBody)

{
  code *pcVar1;
  FunctionBody *this_00;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  WriteBarrierPtr<ObjTypeSpecFldInfo> **ppWVar5;
  Recycler *this_01;
  WriteBarrierPtr<ObjTypeSpecFldInfo> *ptr;
  TrackAllocData local_48;
  FunctionBody *local_20;
  FunctionBody *functionBody_local;
  Recycler *recycler_local;
  ObjTypeSpecFldInfoArray *this_local;
  
  local_20 = functionBody;
  functionBody_local = (FunctionBody *)recycler;
  recycler_local = (Recycler *)this;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4b2,"(recycler != nullptr)","recycler != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (local_20 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4b3,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  uVar3 = Js::FunctionBody::GetInlineCacheCount(local_20);
  if (uVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4b4,"(functionBody->GetInlineCacheCount() != 0)",
                       "functionBody->GetInlineCacheCount() != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__((WriteBarrierPtr *)this);
  this_00 = functionBody_local;
  if (*ppWVar5 == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
    uVar3 = Js::FunctionBody::GetInlineCacheCount(local_20);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::typeinfo,0,
               (ulong)uVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
               ,0x4bc);
    this_01 = Memory::Recycler::TrackAllocInfo((Recycler *)this_00,&local_48);
    uVar3 = Js::FunctionBody::GetInlineCacheCount(local_20);
    ptr = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>,false>
                    ((Memory *)this_01,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)uVar3);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>_>::operator=
              (&this->infoArray,ptr);
    uVar3 = Js::FunctionBody::GetInlineCacheCount(local_20);
    this->infoCount = uVar3;
  }
  else {
    uVar3 = Js::FunctionBody::GetInlineCacheCount(local_20);
    if (uVar3 != this->infoCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x4b8,"(functionBody->GetInlineCacheCount() == this->infoCount)",
                         "functionBody->GetInlineCacheCount() == this->infoCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void ObjTypeSpecFldInfoArray::EnsureArray(Recycler *const recycler, Js::FunctionBody *const functionBody)
{
    Assert(recycler != nullptr);
    Assert(functionBody != nullptr);
    Assert(functionBody->GetInlineCacheCount() != 0);

    if (this->infoArray)
    {
        Assert(functionBody->GetInlineCacheCount() == this->infoCount);
        return;
    }

    this->infoArray = RecyclerNewArrayZ(recycler, Field(ObjTypeSpecFldInfo*), functionBody->GetInlineCacheCount());
#if DBG
    this->infoCount = functionBody->GetInlineCacheCount();
#endif
}